

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listenable_impl.hpp
# Opt level: O0

void __thiscall
wigwag::detail::
listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
::handler_node::release_token_impl(handler_node *this)

{
  bool bVar1;
  uint uVar2;
  listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
  *plVar3;
  handler_processor *phVar4;
  shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar5;
  lock_primitive *plVar6;
  handlers_container *this_00;
  anon_class_8_1_8991fb9c_for__f_conflict local_50;
  undefined1 local_48 [8];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_include_wigwag_detail_listenable_impl_hpp:111:57)>
  sg_1;
  anon_class_8_1_8991fb9c_for__f_conflict local_28;
  undefined1 local_20 [8];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_include_wigwag_detail_listenable_impl_hpp:101:53)>
  sg;
  handler_node *this_local;
  
  sg._8_8_ = this;
  plVar3 = intrusive_ptr<wigwag::detail::listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
           ::operator*(&this->_listenable_impl);
  life_assurance::intrusive_life_tokens::life_assurance::release_life_assurance
            (&this->super_life_assurance,&plVar3->super_shared_data);
  uVar2 = (*(this->super_implementation)._vptr_implementation[3])();
  if ((uVar2 & 1) == 0) {
    plVar3 = intrusive_ptr<wigwag::detail::listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
             ::operator->(&this->_listenable_impl);
    phVar4 = get_handler_processor(plVar3);
    bVar1 = state_populating::populator_only::
            handler_processor<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::has_withdraw_state(phVar4);
    if (bVar1) {
      plVar3 = intrusive_ptr<wigwag::detail::listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
               ::operator->(&this->_listenable_impl);
      plVar6 = get_lock_primitive(plVar3);
      threading::shared_recursive_mutex::lock_primitive::lock_nonrecursive(plVar6);
      local_28.this = this;
      at_scope_exit<wigwag::detail::listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,std::__cxx11::string>>,wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>::handler_node::release_token_impl()::_lambda()_1_>
                ((detail *)local_20,&local_28);
      plVar3 = intrusive_ptr<wigwag::detail::listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
               ::operator->(&this->_listenable_impl);
      phVar4 = get_handler_processor(plVar3);
      psVar5 = storage_for<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::ref((storage_for<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&(this->_handler).obj);
      state_populating::populator_only::
      handler_processor<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::withdraw_state(phVar4,psVar5);
      scope_guard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/include/wigwag/detail/listenable_impl.hpp:101:53)>
      ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_include_wigwag_detail_listenable_impl_hpp:101:53)>
                      *)local_20);
    }
  }
  psVar5 = storage_for<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::ref((storage_for<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&(this->_handler).obj);
  std::
  shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~shared_ptr(psVar5);
  bVar1 = life_assurance::intrusive_life_tokens::life_assurance::release_node
                    (&this->super_life_assurance);
  if (bVar1) {
    plVar3 = intrusive_ptr<wigwag::detail::listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
             ::operator->(&this->_listenable_impl);
    plVar6 = get_lock_primitive(plVar3);
    threading::shared_recursive_mutex::lock_primitive::lock_nonrecursive(plVar6);
    local_50.this = this;
    at_scope_exit<wigwag::detail::listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,std::__cxx11::string>>,wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>::handler_node::release_token_impl()::_lambda()_2_>
              ((detail *)local_48,&local_50);
    plVar3 = intrusive_ptr<wigwag::detail::listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
             ::operator->(&this->_listenable_impl);
    this_00 = get_handlers_container(plVar3);
    intrusive_list<wigwag::detail::listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>::handler_node>
    ::erase(this_00,this);
    scope_guard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/include/wigwag/detail/listenable_impl.hpp:111:57)>
    ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_include_wigwag_detail_listenable_impl_hpp:111:57)>
                    *)local_48);
    if (this != (handler_node *)0x0) {
      (*(this->super_implementation)._vptr_implementation[2])();
    }
  }
  return;
}

Assistant:

virtual void release_token_impl()
            {
                life_assurance::release_life_assurance(*_listenable_impl);

                if (!suppress_populator() && _listenable_impl->get_handler_processor().has_withdraw_state())
                {
                    _listenable_impl->get_lock_primitive().lock_nonrecursive();
                    auto sg = detail::at_scope_exit([&] { _listenable_impl->get_lock_primitive().unlock_nonrecursive(); } );
                    _listenable_impl->get_handler_processor().withdraw_state(_handler.ref());
                }

                _handler.ref().~handler_type();

                if (life_assurance::release_node())
                {
                    {
                        _listenable_impl->get_lock_primitive().lock_nonrecursive();
                        auto sg = detail::at_scope_exit([&] { _listenable_impl->get_lock_primitive().unlock_nonrecursive(); } );
                        _listenable_impl->get_handlers_container().erase(*this);
                    }
                    delete this;
                }
            }